

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  int y_00;
  size_t sVar3;
  char *ctx;
  int y;
  int x;
  char s [100];
  int ai_move;
  int player_move;
  int j;
  int i;
  char c;
  
  i = 0;
  printf("\nREVERSI\n");
  do {
    printf("You can enter 0 to go first, 1 for AI to go first\n");
    __isoc99_scanf("%c",(long)&j + 3);
    if (j._3_1_ == '0') {
      AI_COLOR = 4;
      printf("You can go first on the first game, then we will take turns.\n");
      printf("You will be white - (O)\n");
      printf("I will be black - (X).\n");
      goto LAB_001023e5;
    }
  } while (j._3_1_ != '1');
  AI_COLOR = 5;
  printf("I will go first on the first game, then we will take turns.\n");
  printf("I will be white - (O)\n");
  printf("You will be black - (X).\n");
LAB_001023e5:
  clean_stdin();
  printf("Select a square for your move by typing a digit for the row\n");
  printf("and a letter for the column with no spaces between.");
  printf("\nGood luck! Press Enter to start.\n");
  do {
    iVar2 = getchar();
  } while (iVar2 != 10);
  while( true ) {
    printf("You can choose the difficulty for the game.\n");
    printf("Easy   - 0\n");
    printf("Normal - 1\n");
    printf("Hard   - 2\n");
    printf("Hell   - 3\n");
    __isoc99_scanf("%c");
    if (j._3_1_ == '0') break;
    if (j._3_1_ == '1') {
      MODE = 1;
      ctx = "You choose the normal mode\n\n";
      printf("You choose the normal mode\n\n");
      goto LAB_00102513;
    }
    if (j._3_1_ == '2') {
      MODE = 2;
      ctx = "You choose the hard mode\n\n";
      printf("You choose the hard mode\n\n");
      goto LAB_00102513;
    }
    if (j._3_1_ == '3') {
      MODE = 3;
      ctx = "You choose the hell mode\n\n";
      printf("You choose the hell mode\n\n");
LAB_00102513:
      clean_stdin();
      init((EVP_PKEY_CTX *)ctx);
LAB_0010251d:
      bVar1 = false;
      s[0x60] = '\0';
      s[0x61] = '\0';
      s[0x62] = '\0';
      s[99] = '\0';
      if (AI_COLOR == 4) {
        s._96_4_ = runAI();
      }
      for (player_move = 0; player_move < 8; player_move = player_move + 1) {
        for (ai_move = 0; ai_move < 8; ai_move = ai_move + 1) {
          if (((int)chessboard[player_move][ai_move] == 6 - AI_COLOR) ||
             (chessboard[player_move][ai_move] == '\x03')) {
            bVar1 = true;
            break;
          }
        }
      }
      while (bVar1) {
        memset(&y,0,100);
        printf("Please enter your move (row column- no space):");
        __isoc99_scanf("%s");
        clean_stdin();
        sVar3 = strlen((char *)&y);
        if (sVar3 == 2) {
          iVar2 = (char)y + -0x31;
          y_00 = y._1_1_ + -0x61;
          if ((((iVar2 < 0) || (7 < iVar2)) || (y_00 < 0)) || (7 < y_00)) {
            printf("Not a valid move, try again.\n");
          }
          else {
            if (((int)chessboard[iVar2][y_00] == 6 - AI_COLOR) ||
               (chessboard[iVar2][y_00] == '\x03')) {
              putchess(iVar2,y_00,9 - AI_COLOR);
              refresh();
              break;
            }
            printf("Not a valid move, try again.\n");
          }
        }
        else {
          printf("Not a valid move, try again.\n");
        }
      }
      if (AI_COLOR == 5) {
        s._96_4_ = runAI();
      }
      iVar2 = gameover();
      if (iVar2 != 1) {
        if (bVar1) {
          if (s._96_4_ == 0) {
            printf("AI have to pass. You will go.\n");
          }
        }
        else {
          printf("You have to pass. Press enter.\n");
          do {
            iVar2 = getchar();
          } while (iVar2 != 10);
        }
        goto LAB_0010251d;
      }
      printf("\nDo you want to play again?(y/n)\n");
      while( true ) {
        iVar2 = getchar();
        j._3_1_ = (char)iVar2;
        clean_stdin();
        if ((j._3_1_ == 'Y') || (j._3_1_ == 'y')) break;
        if ((j._3_1_ == 'N') || (j._3_1_ == 'n')) {
          printf("\nGoodbye!\n");
          getchar();
          return 0;
        }
      }
    }
  }
  MODE = 0;
  ctx = "You choose the easy mode\n\n";
  printf("You choose the easy mode\n\n");
  goto LAB_00102513;
}

Assistant:

int main() {
    char c;
    printf("\nREVERSI\n");
/*#ifdef AI_COLOR_BLACK
	printf("You can go first on the first game, then we will take turns.\n");
#endif
#ifdef AI_COLOR_WHITE
	printf("I will go first on the first game, then we will take turns.\n");
#endif*/
    while (1) {
        printf("You can enter 0 to go first, 1 for AI to go first\n");
        scanf("%c", &c);
        if (c == '0') {
            AI_COLOR = WHITE;
            printf("You can go first on the first game, then we will take turns.\n");
            printf("You will be white - (O)\n");
            printf("I will be black - (X).\n");
            break;
        } else if (c == '1') {
            AI_COLOR = BLACK;
            printf("I will go first on the first game, then we will take turns.\n");
            printf("I will be white - (O)\n");
            printf("You will be black - (X).\n");
            break;
        }
    }
    clean_stdin();

    printf("Select a square for your move by typing a digit for the row\n");
    printf("and a letter for the column with no spaces between.");
    printf("\nGood luck! Press Enter to start.\n");
    while (getchar() != '\n') {}

    while (1) {
        while (1) {
            printf("You can choose the difficulty for the game.\n");
            printf("Easy   - 0\n");
            printf("Normal - 1\n");
            printf("Hard   - 2\n");
            printf("Hell   - 3\n");
            scanf("%c", &c);
            if (c == '0') {
                MODE = MODE_EASY;
                printf("You choose the easy mode\n\n");
                break;
            } else if (c == '1') {
                MODE = MODE_NORM;
                printf("You choose the normal mode\n\n");
                break;
            } else if (c == '2') {
                MODE = MODE_HARD;
                printf("You choose the hard mode\n\n");
                break;
            } else if (c == '3') {
                MODE = MODE_HELL;
                printf("You choose the hell mode\n\n");
                break;
            }
        }
        clean_stdin();
        init();
        int i, j;
        while (1) {
            int player_move = 0, ai_move = 0;

            if (AI_COLOR == WHITE) {
                ai_move = runAI();
            }

/*#ifdef AI_COLOR_WHITE
			ai_move = runAI();
#endif*/

            for (i = 0; i < SIZE; i++) {
                for (j = 0; j < SIZE; j++) {
                    if (chessboard[i][j] == COLOR_(COLOR_rev(AI_COLOR)) || chessboard[i][j] == BOTH)
/*#ifdef AI_COLOR_BLACK
					if (chessboard[i][j] == WHITE_ || chessboard[i][j] == BOTH)
#endif
#ifdef AI_COLOR_WHITE
					if (chessboard[i][j] == BLACK_ || chessboard[i][j] == BOTH)
#endif*/
                    {
                        player_move = 1;
                        break;
                    }
                }
            }

            while (player_move) {

                char s[100] = {0};
                printf("Please enter your move (row column- no space):");
                scanf("%s", s);
                clean_stdin();
                if (strlen(s) != 2) {
                    printf("Not a valid move, try again.\n");
                    continue;
                }
                int x = s[0] - '1';
                int y = s[1] - 'a';
                if (x < 0 || x >= SIZE || y < 0 || y >= SIZE) {
                    printf("Not a valid move, try again.\n");
                    continue;
                }

                if (chessboard[x][y] != COLOR_(COLOR_rev(AI_COLOR)) && chessboard[x][y] != BOTH)
/*#ifdef AI_COLOR_BLACK
				if (chessboard[x][y] != WHITE_&&chessboard[x][y] != BOTH)
#endif
#ifdef AI_COLOR_WHITE
				if (chessboard[x][y] != BLACK_&&chessboard[x][y] != BOTH)
#endif*/
                {
                    printf("Not a valid move, try again.\n");
                    continue;
                }

                putchess(x, y, COLOR_rev(AI_COLOR));

/*#ifdef AI_COLOR_BLACK
				putchess(x, y, WHITE);
#endif
#ifdef AI_COLOR_WHITE
				putchess(x, y, BLACK);
#endif*/
                refresh();
                break;
            }

            if (AI_COLOR == BLACK) {
                ai_move = runAI();
            }
/*#ifdef AI_COLOR_BLACK
			ai_move = runAI();
#endif*/

            if (gameover() == 1) {
                break;
            } else if (player_move == 0) {
                printf("You have to pass. Press enter.\n");
                while (getchar() != '\n') {}
            } else if (ai_move == 0) {
                printf("AI have to pass. You will go.\n");
            }
        }
        printf("\nDo you want to play again?(y/n)\n");
        while (1) {
            c = getchar();
            clean_stdin();
            if (c == 'Y' || c == 'y') {
                break;
            } else if (c == 'N' || c == 'n') {
                printf("\nGoodbye!\n");
                getchar();
                return 0;
            }
        }
    }
    return 0;
}